

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TSymbol * __thiscall
glslang::HlslParseContext::lookupUserType(HlslParseContext *this,TString *typeName,TType *type)

{
  char cVar1;
  int iVar2;
  TSymbol *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pTVar3 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,typeName,(bool *)0x0,
                              (bool *)0x0,(int *)0x0);
  if ((pTVar3 != (TSymbol *)0x0) &&
     (iVar2 = (*pTVar3->_vptr_TSymbol[9])(pTVar3), CONCAT44(extraout_var,iVar2) != 0)) {
    iVar2 = (*pTVar3->_vptr_TSymbol[9])(pTVar3);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xb0))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
    if (cVar1 != '\0') {
      iVar2 = (*pTVar3->_vptr_TSymbol[0xc])(pTVar3);
      TType::shallowCopy(type,(TType *)CONCAT44(extraout_var_01,iVar2));
      return pTVar3;
    }
  }
  return (TSymbol *)0x0;
}

Assistant:

TSymbol* HlslParseContext::lookupUserType(const TString& typeName, TType& type)
{
    TSymbol* symbol = symbolTable.find(typeName);
    if (symbol && symbol->getAsVariable() && symbol->getAsVariable()->isUserType()) {
        type.shallowCopy(symbol->getType());
        return symbol;
    } else
        return nullptr;
}